

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChDampingCosserat::ComputeDampingMatrix
          (ChDampingCosserat *this,ChMatrixNM<double,_6,_6> *R,ChVector<double> *dstrain_e,
          ChVector<double> *dstrain_k)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  ChVector<double> v;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  ChVector<double> strain_k_inc;
  ChVector<double> strain_e_inc;
  double local_f8 [4];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60 [6];
  
  local_78 = 0.0;
  dStack_70 = 0.0;
  lVar5 = 0;
  local_68 = 0.0;
  local_88 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_c8 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_60[3] = dstrain_e->m_data[0];
  local_60[4] = dstrain_e->m_data[1];
  local_60[5] = dstrain_e->m_data[2];
  local_60[0] = dstrain_k->m_data[0];
  local_60[1] = dstrain_k->m_data[1];
  local_60[2] = dstrain_k->m_data[2];
  (*this->_vptr_ChDampingCosserat[2])();
  pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x12;
  pdVar3 = (double *)R;
  do {
    local_60[lVar5 + 3] = local_60[lVar5 + 3] + 1e-06;
    (*this->_vptr_ChDampingCosserat[2])(this,&local_b8,&local_d8,local_60 + 3,local_60);
    local_f8[0] = local_b8 - local_78;
    local_f8[1] = dStack_b0 - dStack_70;
    local_f8[2] = local_a8 - local_68;
    lVar2 = 0;
    pdVar1 = pdVar3;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    local_f8[0] = local_d8 - local_98;
    local_f8[1] = dStack_d0 - dStack_90;
    local_f8[2] = local_c8 - local_88;
    lVar2 = 0;
    pdVar1 = pdVar4;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    lVar5 = lVar5 + 1;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  } while (lVar5 != 3);
  pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 3;
  pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x15;
  lVar5 = 0;
  do {
    local_60[lVar5] = local_60[lVar5] + 1e-06;
    (*this->_vptr_ChDampingCosserat[2])(this,&local_b8,&local_d8,local_60 + 3,local_60);
    local_f8[0] = local_b8 - local_78;
    local_f8[1] = dStack_b0 - dStack_70;
    local_f8[2] = local_a8 - local_68;
    lVar2 = 0;
    pdVar1 = pdVar4;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    local_f8[0] = local_d8 - local_98;
    local_f8[1] = dStack_d0 - dStack_90;
    local_f8[2] = local_c8 - local_88;
    lVar2 = 0;
    pdVar1 = pdVar3;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    local_60[lVar5] = local_60[lVar5] + -1e-06;
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 1;
    pdVar3 = pdVar3 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void ChDampingCosserat::ComputeDampingMatrix(ChMatrixNM<double, 6, 6>& R,
                                             const ChVector<>& dstrain_e,
                                             const ChVector<>& dstrain_k) {
    double epsi = 1e-6;
    double invepsi = 1.0 / epsi;
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> bstress_n;
    ChVector<> bstress_m;
    ChVector<> strain_e_inc = dstrain_e;
    ChVector<> strain_k_inc = dstrain_k;
    this->ComputeStress(astress_n, astress_m, dstrain_e, dstrain_k);
    for (int i = 0; i < 3; ++i) {
        strain_e_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        R.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        R.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
    }
    for (int i = 0; i < 3; ++i) {
        strain_k_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        R.block(0, i + 3, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        R.block(3, i + 3, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
        strain_k_inc[i] -= epsi;
    }
}